

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Entry * __thiscall
kj::
Table<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>_>
::insert(Table<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>_>
         *this,Entry *row)

{
  RemoveConst<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *pRVar1;
  Entry *pEVar2;
  undefined6 uVar3;
  RemoveConst<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *pRVar4;
  size_t sVar5;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,this,
             ((long)(this->rows).builder.pos - (long)(this->rows).builder.ptr >> 3) *
             -0x5555555555555555,row,0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    pRVar4 = (this->rows).builder.pos;
    if (pRVar4 == (this->rows).builder.endPtr) {
      pRVar1 = (this->rows).builder.ptr;
      sVar5 = 4;
      if (pRVar4 != pRVar1) {
        sVar5 = ((long)pRVar4 - (long)pRVar1 >> 3) * 0x5555555555555556;
      }
      Vector<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry>::setCapacity(&this->rows,sVar5);
      pRVar4 = (this->rows).builder.pos;
    }
    uVar3 = *(undefined6 *)&row->field_0x12;
    pRVar4->value = row->value;
    *(undefined6 *)&pRVar4->field_0x12 = uVar3;
    sVar5 = (row->key).content.size_;
    (pRVar4->key).content.ptr = (row->key).content.ptr;
    (pRVar4->key).content.size_ = sVar5;
    pEVar2 = (this->rows).builder.pos;
    (this->rows).builder.pos = pEVar2 + 1;
    return pEVar2;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}